

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O0

void __thiscall wasm::CoalesceLocals::calculateInterferences(CoalesceLocals *this)

{
  allocator<bool> *this_00;
  uint uVar1;
  Expression *pEVar2;
  BasicBlock *this_01;
  bool bVar3;
  Index IVar4;
  Function *pFVar5;
  vector<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
  *this_02;
  size_type sVar6;
  pointer pBVar7;
  size_type sVar8;
  ulong uVar9;
  reference pvVar10;
  LocalSet *pLVar11;
  reference pvVar12;
  size_t sVar13;
  reference puVar14;
  reference rVar15;
  uint local_260;
  Index j_1;
  uint i_5;
  iterator __end1_1;
  iterator __begin1_1;
  SetOfLocals *__range1_1;
  Index j;
  Index i_4;
  size_t numParams;
  iterator iStack_228;
  uint other;
  iterator __end3_1;
  iterator __begin3_1;
  SetOfLocals *__range3_1;
  Index newValue;
  LocalSet *set;
  undefined1 auStack_1f8 [7];
  bool erased;
  _Bit_type local_1f0;
  uint local_1e4;
  reference pvStack_1e0;
  Index index_2;
  value_type *action_1;
  Index i_3;
  uint index_1;
  iterator __end3;
  iterator __begin3;
  SetOfLocals *__range3;
  Literals local_1b0;
  uintptr_t local_178;
  Type local_170;
  Type type;
  Index i_2;
  Index i_1;
  _Bit_type local_158;
  Index local_14c;
  reference pvStack_148;
  Index index;
  value_type *action;
  undefined1 local_138 [4];
  int i;
  SetOfLocals live;
  undefined1 local_118 [8];
  vector<bool,_std::allocator<bool>_> endsLiveRange;
  vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *actions;
  reference local_e0;
  unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
  *curr;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
  *__range1;
  Function *func;
  ValueNumbering valueNumbering;
  allocator<unsigned_int> local_29;
  undefined1 local_28 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  CoalesceLocals *this_local;
  
  values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  sparse_square_matrix<bool>::recreate
            (&this->interferences,
             (this->
             super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
             ).
             super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
             numLocals);
  uVar1 = (this->
          super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
          ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
          numLocals;
  std::allocator<unsigned_int>::allocator(&local_29);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,(ulong)uVar1,&local_29)
  ;
  std::allocator<unsigned_int>::~allocator(&local_29);
  ValueNumbering::ValueNumbering((ValueNumbering *)&func);
  pFVar5 = Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::getFunction
                     ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *)
                      &(this->
                       super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                       ).
                       super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     );
  this_02 = &(this->
             super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
             ).
             super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
             super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
             .basicBlocks;
  __end1 = std::
           vector<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
           ::begin(this_02);
  curr = (unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
          *)std::
            vector<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
            ::end(this_02);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_*,_std::vector<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_>_>_>
                                *)&curr);
    if (!bVar3) {
      pFVar5 = Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::getFunction
                         ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                           *)&(this->
                              super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                              ).
                              super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                         );
      sVar13 = Function::getNumParams(pFVar5);
      for (__range1_1._4_4_ = 0; __range1_1._0_4_ = __range1_1._4_4_, __range1_1._4_4_ < sVar13;
          __range1_1._4_4_ = __range1_1._4_4_ + 1) {
        while (__range1_1._0_4_ = (uint)__range1_1 + 1, (uint)__range1_1 < sVar13) {
          interfereLowHigh(this,__range1_1._4_4_,(uint)__range1_1);
        }
      }
      this_01 = (this->
                super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                ).
                super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                .
                super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                .entry;
      __end1_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
      _j_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&j_1);
        if (!bVar3) break;
        puVar14 = __gnu_cxx::
                  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&__end1_1);
        uVar1 = *puVar14;
        if (sVar13 <= uVar1) {
          for (local_260 = 0; local_260 < sVar13; local_260 = local_260 + 1) {
            interfereLowHigh(this,local_260,uVar1);
          }
        }
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end1_1);
      }
      ValueNumbering::~ValueNumbering((ValueNumbering *)&func);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
      return;
    }
    local_e0 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_*,_std::vector<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_>_>_>
               ::operator*(&__end1);
    actions = (vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)
              std::
              unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
              ::get(local_e0);
    sVar6 = std::
            unordered_set<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
            ::count(&(this->
                     super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                     ).
                     super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     .liveBlocks,(key_type *)&actions);
    if (sVar6 != 0) {
      pBVar7 = std::
               unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
               ::operator->(local_e0);
      endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)&(pBVar7->contents).actions;
      sVar8 = std::vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>::size
                        ((vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)
                         endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage);
      live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      this_00 = (allocator<bool> *)
                ((long)&live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 6);
      std::allocator<bool>::allocator(this_00);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_118,sVar8,
                 (bool *)((long)&live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7),this_00);
      std::allocator<bool>::~allocator
                ((allocator<bool> *)
                 ((long)&live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 6));
      pBVar7 = std::
               unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
               ::operator->(local_e0);
      SortedVector::SortedVector((SortedVector *)local_138,&(pBVar7->contents).end);
      sVar8 = std::vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>::size
                        ((vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)
                         endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage);
      action._4_4_ = (int)sVar8;
      while (action._4_4_ = action._4_4_ + -1, -1 < action._4_4_) {
        pvStack_148 = std::vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>::
                      operator[]((vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                                  *)endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl
                                    .super__Bvector_impl_data._M_end_of_storage,(long)action._4_4_);
        local_14c = pvStack_148->index;
        bVar3 = LivenessAction::isGet(pvStack_148);
        if (bVar3) {
          bVar3 = SortedVector::has((SortedVector *)local_138,local_14c);
          if (!bVar3) {
            rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_118,(long)action._4_4_)
            ;
            _i_2 = rVar15;
            std::_Bit_reference::operator=((_Bit_reference *)&i_2,true);
            SortedVector::insert((SortedVector *)local_138,local_14c);
          }
        }
        else {
          bVar3 = SortedVector::erase((SortedVector *)local_138,local_14c);
          if (bVar3) {
            pvStack_148->effective = true;
          }
        }
      }
      pBVar7 = std::
               unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
               ::operator->(local_e0);
      bVar3 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_138,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pBVar7);
      if (!bVar3) {
        __assert_fail("live == curr->contents.start",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CoalesceLocals.cpp"
                      ,0xc2,"void wasm::CoalesceLocals::calculateInterferences()");
      }
      pBVar7 = std::
               unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
               ::get(local_e0);
      if (pBVar7 == (this->
                    super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                    ).
                    super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                    .
                    super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                    .entry) {
        type.id._4_4_ = 0;
        while( true ) {
          uVar9 = (ulong)type.id._4_4_;
          sVar13 = Function::getNumParams(pFVar5);
          if (sVar13 <= uVar9) break;
          IVar4 = ValueNumbering::getUniqueValue((ValueNumbering *)&func);
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,
                               (ulong)type.id._4_4_);
          *pvVar10 = IVar4;
          type.id._4_4_ = type.id._4_4_ + 1;
        }
        sVar13 = Function::getNumParams(pFVar5);
        type.id._0_4_ = (uint)sVar13;
        while( true ) {
          uVar9 = (ulong)(uint)type.id;
          sVar13 = Function::getNumLocals(pFVar5);
          if (sVar13 <= uVar9) break;
          local_178 = (uintptr_t)Function::getLocalType(pFVar5,(uint)type.id);
          local_170 = (Type)local_178;
          bVar3 = LiteralUtils::canMakeZero((Type)local_178);
          if (bVar3) {
            wasm::Literal::makeZeros(&local_1b0,local_170);
            IVar4 = ValueNumbering::getValue((ValueNumbering *)&func,&local_1b0);
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,
                                 (ulong)(uint)type.id);
            *pvVar10 = IVar4;
            Literals::~Literals(&local_1b0);
          }
          else {
            IVar4 = ValueNumbering::getUniqueValue((ValueNumbering *)&func);
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,
                                 (ulong)(uint)type.id);
            *pvVar10 = IVar4;
          }
          type.id._0_4_ = (uint)type.id + 1;
        }
      }
      else {
        pBVar7 = std::
                 unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                 ::operator->(local_e0);
        __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pBVar7);
        _i_3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pBVar7);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            (&__end3,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                      *)&i_3);
          if (!bVar3) break;
          puVar14 = __gnu_cxx::
                    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator*(&__end3);
          action_1._4_4_ = *puVar14;
          IVar4 = ValueNumbering::getUniqueValue((ValueNumbering *)&func);
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,
                               (ulong)action_1._4_4_);
          *pvVar10 = IVar4;
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&__end3);
        }
      }
      action_1._0_4_ = 0;
      while( true ) {
        uVar9 = (ulong)(uint)action_1;
        sVar8 = std::vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>::size
                          ((vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)
                           endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage);
        if (sVar8 <= uVar9) break;
        pvStack_1e0 = std::vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>::
                      operator[]((vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                                  *)endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl
                                    .super__Bvector_impl_data._M_end_of_storage,
                                 (ulong)(uint)action_1);
        local_1e4 = pvStack_1e0->index;
        bVar3 = LivenessAction::isGet(pvStack_1e0);
        if (bVar3) {
          rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_118,(ulong)(uint)action_1
                             );
          _auStack_1f8 = rVar15;
          bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_1f8);
          if (bVar3) {
            bVar3 = SortedVector::erase((SortedVector *)local_138,pvStack_1e0->index);
            if (!bVar3) {
              __assert_fail("erased",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CoalesceLocals.cpp"
                            ,0xf0,"void wasm::CoalesceLocals::calculateInterferences()");
            }
          }
        }
        else {
          pLVar11 = Expression::cast<wasm::LocalSet>(*pvStack_1e0->origin);
          bVar3 = Expression::is<wasm::LocalGet>(pLVar11->value);
          if (bVar3) {
LAB_0159094e:
            bVar3 = false;
            if ((uint)action_1 != 0) {
              pEVar2 = pLVar11->value;
              pvVar12 = std::vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>::
                        operator[]((vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                                    *)endsLiveRange.super__Bvector_base<std::allocator<bool>_>.
                                      _M_impl.super__Bvector_impl_data._M_end_of_storage,
                                   (ulong)((uint)action_1 - 1));
              bVar3 = pEVar2 == *pvVar12->origin;
            }
            if (!bVar3) {
              __assert_fail("i > 0 && set->value == *actions[i - 1].origin",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CoalesceLocals.cpp"
                            ,0xfb,"void wasm::CoalesceLocals::calculateInterferences()");
            }
            pvVar12 = std::vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>::
                      operator[]((vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                                  *)endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl
                                    .super__Bvector_impl_data._M_end_of_storage,
                                 (ulong)((uint)action_1 - 1));
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,
                                 (ulong)pvVar12->index);
            __range3_1._4_4_ = *pvVar10;
          }
          else {
            bVar3 = Expression::is<wasm::LocalSet>(pLVar11->value);
            if (bVar3) goto LAB_0159094e;
            __range3_1._4_4_ = ValueNumbering::getValue((ValueNumbering *)&func,pLVar11->value);
          }
          pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,
                               (ulong)local_1e4);
          *pvVar10 = __range3_1._4_4_;
          if ((pvStack_1e0->effective & 1U) != 0) {
            __end3_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_138);
            iStack_228 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_138
                                   );
            while( true ) {
              bVar3 = __gnu_cxx::operator!=(&__end3_1,&stack0xfffffffffffffdd8);
              if (!bVar3) break;
              puVar14 = __gnu_cxx::
                        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator*(&__end3_1);
              uVar1 = *puVar14;
              if (uVar1 == local_1e4) {
                __assert_fail("other != index",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CoalesceLocals.cpp"
                              ,0x110,"void wasm::CoalesceLocals::calculateInterferences()");
              }
              pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,
                                   (ulong)uVar1);
              if (*pvVar10 != __range3_1._4_4_) {
                interfere(this,uVar1,local_1e4);
              }
              __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&__end3_1);
            }
            SortedVector::insert((SortedVector *)local_138,pvStack_1e0->index);
          }
        }
        action_1._0_4_ = (uint)action_1 + 1;
      }
      SortedVector::~SortedVector((SortedVector *)local_138);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_118);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_*,_std::vector<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void CoalesceLocals::calculateInterferences() {
  interferences.recreate(numLocals);

  // We will track the values in each local, using a numbering where each index
  // represents a unique different value. This array maps a local index to the
  // value index it contains.
  //
  // To avoid reallocating this array all the time, allocate it once outside the
  // loop.
  std::vector<Index> values(numLocals);

  ValueNumbering valueNumbering;

  auto* func = getFunction();

  for (auto& curr : basicBlocks) {
    if (liveBlocks.count(curr.get()) == 0) {
      continue; // ignore dead blocks
    }

    // First, find which gets end a live range. While doing so, also calculate
    // the effectiveness of sets.
    auto& actions = curr->contents.actions;
    std::vector<bool> endsLiveRange(actions.size(), false);
    auto live = curr->contents.end;
    for (int i = int(actions.size()) - 1; i >= 0; i--) {
      auto& action = actions[i];
      auto index = action.index;
      if (action.isGet()) {
        if (!live.has(index)) {
          // The local is not live after us, so its liveness ends here.
          endsLiveRange[i] = true;
          live.insert(index);
        }
      } else {
        // This is a set. Check if the local is alive after it; if it is then
        // the set if effective as there is some get that can read the value.
        if (live.erase(index)) {
          action.effective = true;
        }
      }
    }

    // We have processed from the end of the block to the start, updating |live|
    // as we go, and now it must be equal to the state at the start of the
    // block. We will also use |live| in the next loop, and assume it begins
    // in that state.
    assert(live == curr->contents.start);

    // Now that we know live ranges, check if locals interfere in this block.
    // Locals interfere if they might contain different values on areas where
    // their live ranges overlap. To evaluate that, we do an analysis inside
    // the block that gives each set a unique value number, and as those flow
    // around through copies between sets we can see when sets are guaranteed to
    // be equal.

    if (curr.get() == entry) {
      // Each parameter is assumed to have a different value on entry.
      for (Index i = 0; i < func->getNumParams(); i++) {
        values[i] = valueNumbering.getUniqueValue();
      }

      for (Index i = func->getNumParams(); i < func->getNumLocals(); i++) {
        auto type = func->getLocalType(i);
        if (!LiteralUtils::canMakeZero(type)) {
          // The default value for a type for which we can't make a zero cannot
          // be used anyhow, but we must give it some value in this analysis. A
          // unique one seems least likely to result in surprise during
          // debugging.
          values[i] = valueNumbering.getUniqueValue();
        } else {
          values[i] = valueNumbering.getValue(Literal::makeZeros(type));
        }
      }
    } else {
      // In any block but the entry, assume that each live local might have a
      // different value at the start.
      // TODO: Propagating value IDs across blocks could identify more copies,
      //       however, it would also be nonlinear.
      for (auto index : curr->contents.start) {
        values[index] = valueNumbering.getUniqueValue();
      }
    }

    // Traverse through the block from start to finish. We keep track of both
    // liveness (in |live|) and the value IDs in each local (in |values|)
    // while doing so.
    for (Index i = 0; i < actions.size(); i++) {
      auto& action = actions[i];
      auto index = action.index;
      if (action.isGet()) {
        if (endsLiveRange[i]) {
          [[maybe_unused]] bool erased = live.erase(action.index);
          assert(erased);
        }
        continue;
      }

      // This is a set. Find the value being assigned to the local.
      auto* set = (*action.origin)->cast<LocalSet>();
      Index newValue;
      if (set->value->is<LocalGet>() || set->value->is<LocalSet>()) {
        // This is a copy: Either it is a get or a tee, that occurs right
        // before us. Set our new value to theirs.
        assert(i > 0 && set->value == *actions[i - 1].origin);
        newValue = values[actions[i - 1].index];
      } else {
        // This is not a copy.
        newValue = valueNumbering.getValue(set->value);
      }
      values[index] = newValue;

      // If this set has no gets that read from it, then it does not start a
      // live range, and it cannot cause interference.
      if (!action.effective) {
        continue;
      }

      // Update interferences: This will interfere with any other local that
      // is currently live and contains a different value.
      for (auto other : live) {
        // This index cannot have been live before this set (as we would be
        // trampling some other set before us, if so; and then that set would
        // have been ineffective). We will mark this index as live right after
        // this loop).
        assert(other != index);
        if (values[other] != newValue) {
          interfere(other, index);
        }
      }
      live.insert(action.index);
    }

    // Note that we do not need to do anything for merges: while in general an
    // interference can happen either in a block or when control flow merges,
    // in wasm we have default values for all locals. As a result, if a local is
    // live at the beginning of a block, it will be live at the ends of *all*
    // the blocks reaching it: there is no possibility of an "unset local." That
    // is, imagine we have this merge with a conflict:
    //
    //  [a is set to some value] ->-
    //                              |
    //                              |->- [merge block where a and b are used]
    //                              |
    //  [b is set to some value] ->-
    //
    // It is true that a conflict happens in the merge block, and if we had
    // unset locals then the top block would have b unset, and the bottom block
    // would have a unset, and so there would be no conflict there and the
    // problem would only appear in the merge. But in wasm, that a and b are
    // used in the merge block means that they are live at the end of both the
    // top and bottom block, and that liveness will extend all the way back to
    // *some* set of those values, possibly only the zero-initialization at the
    // function start. Therefore a conflict will be noticed in both the top and
    // bottom blocks, and that merge block does not need to reason about merging
    // its inputs. In other words, a conflict will appear in the middle of a
    // block, somewhere, and therefore we leave it to that block to identify,
    // and so blocks only need to reason about their own contents and not what
    // arrives to them.
    //
    // The one exception here is the entry to the function, see below.
  }

  // We must not try to coalesce parameters as they are fixed. Mark them as
  // "interfering" so that we do not need to special-case them later.
  auto numParams = getFunction()->getNumParams();
  for (Index i = 0; i < numParams; i++) {
    for (Index j = i + 1; j < numParams; j++) {
      interfereLowHigh(i, j);
    }
  }

  // We must handle interference between uses of the zero-init value and
  // parameters manually. A zero initialization represents a set (to a default
  // value), and that set would be what alerts us to a conflict, but there is no
  // actual set in the IR since the zero-init value is applied implicitly.
  for (auto i : entry->contents.start) {
    if (i >= numParams) {
      for (Index j = 0; j < numParams; j++) {
        interfereLowHigh(j, i);
      }
    }
  }
}